

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spxsteeppr.hpp
# Opt level: O2

void __thiscall
soplex::
SPxSteepPR<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
::setupWeights(SPxSteepPR<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
               *this,Type type)

{
  VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *this_00;
  VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *this_01;
  uint *puVar1;
  undefined8 *puVar2;
  int iVar3;
  SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *pSVar4;
  pointer pnVar5;
  SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *pSVar6;
  bool bVar7;
  int iVar8;
  int iVar9;
  SPxOut *pSVar10;
  ulong uVar11;
  long lVar12;
  int iVar13;
  long lVar14;
  long lVar15;
  long lVar16;
  double local_d0;
  Verbosity old_verbosity;
  uint uStack_c4;
  int iStack_c0;
  int iStack_bc;
  int *local_b8;
  undefined5 uStack_b0;
  undefined3 uStack_ab;
  uint local_a8;
  undefined3 uStack_a3;
  uint local_a0;
  bool local_9c;
  pointer local_98;
  __shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2> local_78;
  cpp_dec_float<50U,_int,_void> local_68;
  
  pSVar4 = (this->
           super_SPxPricer<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
           ).thesolver;
  this_00 = &pSVar4->weights;
  this_01 = &pSVar4->coWeights;
  if (this->setup == DEFAULT) {
    if (type == ENTER) {
      if (pSVar4->weightsAreSetup == false) {
        iVar13 = (pSVar4->thecovectors->set).thenum;
        lVar16 = 0;
        lVar15 = 0;
      }
      else {
        iVar13 = (pSVar4->thecovectors->set).thenum;
        iVar8 = (int)(((long)(pSVar4->coWeights).val.
                             super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                             ._M_impl.super__Vector_impl_data._M_finish -
                      (long)(pSVar4->coWeights).val.
                            super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                            ._M_impl.super__Vector_impl_data._M_start) / 0x38);
        if (iVar13 < iVar8) {
          iVar8 = iVar13;
        }
        iVar3 = (pSVar4->thevectors->set).thenum;
        iVar9 = (int)(((long)(pSVar4->weights).val.
                             super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                             ._M_impl.super__Vector_impl_data._M_finish -
                      (long)(pSVar4->weights).val.
                            super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                            ._M_impl.super__Vector_impl_data._M_start) / 0x38);
        if (iVar3 < iVar9) {
          iVar9 = iVar3;
        }
        lVar15 = (long)iVar8;
        lVar16 = (long)iVar9;
      }
      VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
      ::reDim(this_01,iVar13,false);
      lVar12 = (long)(((this->
                       super_SPxPricer<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                       ).thesolver)->thecovectors->set).thenum;
      lVar14 = lVar12 * 0x38;
      for (; lVar15 < lVar12; lVar12 = lVar12 + -1) {
        boost::multiprecision::backends::cpp_dec_float<50u,int,void>::operator=
                  ((cpp_dec_float<50u,int,void> *)
                   ((long)(this_01->val).
                          super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                          ._M_impl.super__Vector_impl_data._M_start[-1].m_backend.data._M_elems +
                   lVar14),2.0);
        lVar14 = lVar14 + -0x38;
      }
      VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
      ::reDim(this_00,(((this->
                        super_SPxPricer<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                        ).thesolver)->thevectors->set).thenum,false);
      lVar14 = (long)(((this->
                       super_SPxPricer<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                       ).thesolver)->thevectors->set).thenum;
      lVar15 = lVar14 * 0x38;
      for (; lVar16 < lVar14; lVar14 = lVar14 + -1) {
        boost::multiprecision::backends::cpp_dec_float<50u,int,void>::operator=
                  ((cpp_dec_float<50u,int,void> *)
                   ((long)(this_00->val).
                          super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                          ._M_impl.super__Vector_impl_data._M_start[-1].m_backend.data._M_elems +
                   lVar15),1.0);
        lVar15 = lVar15 + -0x38;
      }
    }
    else {
      if (pSVar4->weightsAreSetup == false) {
        iVar13 = (pSVar4->thecovectors->set).thenum;
        lVar16 = 0;
      }
      else {
        iVar13 = (pSVar4->thecovectors->set).thenum;
        iVar8 = (int)(((long)(pSVar4->coWeights).val.
                             super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                             ._M_impl.super__Vector_impl_data._M_finish -
                      (long)(pSVar4->coWeights).val.
                            super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                            ._M_impl.super__Vector_impl_data._M_start) / 0x38);
        if (iVar13 < iVar8) {
          iVar8 = iVar13;
        }
        lVar16 = (long)iVar8;
      }
      VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
      ::reDim(this_01,iVar13,false);
      lVar14 = (long)(((this->
                       super_SPxPricer<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                       ).thesolver)->thecovectors->set).thenum;
      lVar15 = lVar14 * 0x38;
      for (; lVar16 < lVar14; lVar14 = lVar14 + -1) {
        boost::multiprecision::backends::cpp_dec_float<50u,int,void>::operator=
                  ((cpp_dec_float<50u,int,void> *)
                   ((long)(this_01->val).
                          super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                          ._M_impl.super__Vector_impl_data._M_start[-1].m_backend.data._M_elems +
                   lVar15),1.0);
        lVar15 = lVar15 + -0x38;
      }
    }
  }
  else {
    pSVar10 = pSVar4->spxout;
    if ((pSVar10 != (SPxOut *)0x0) && (2 < (int)pSVar10->m_verbosity)) {
      _old_verbosity = (_func_int **)CONCAT44(uStack_c4,pSVar10->m_verbosity);
      local_68.data._M_elems[0] = 3;
      (*pSVar10->_vptr_SPxOut[2])();
      pSVar10 = soplex::operator<<(((this->
                                    super_SPxPricer<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                    ).thesolver)->spxout,
                                   " --- initializing steepest edge multipliers");
      std::endl<char,std::char_traits<char>>(pSVar10->m_streams[pSVar10->m_verbosity]);
      pSVar10 = ((this->
                 super_SPxPricer<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                 ).thesolver)->spxout;
      (*pSVar10->_vptr_SPxOut[2])(pSVar10,&old_verbosity);
    }
    VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
    ::reDim(this_01,(((this->
                      super_SPxPricer<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                      ).thesolver)->thecovectors->set).thenum,false);
    if (type == ENTER) {
      uVar11 = (ulong)(uint)(((this->
                              super_SPxPricer<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                              ).thesolver)->thecovectors->set).thenum;
      lVar16 = uVar11 * 0x38;
      while( true ) {
        if ((int)uVar11 < 1) break;
        boost::multiprecision::backends::cpp_dec_float<50u,int,void>::operator=
                  ((cpp_dec_float<50u,int,void> *)
                   ((long)(this_01->val).
                          super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                          ._M_impl.super__Vector_impl_data._M_start[-1].m_backend.data._M_elems +
                   lVar16),1.0);
        uVar11 = (ulong)((int)uVar11 - 1);
        lVar16 = lVar16 + -0x38;
      }
      VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
      ::reDim(this_00,(((this->
                        super_SPxPricer<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                        ).thesolver)->thevectors->set).thenum,false);
      uVar11 = (ulong)(uint)(((this->
                              super_SPxPricer<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                              ).thesolver)->thevectors->set).thenum;
      lVar16 = uVar11 * 7 + -1;
      for (; 0 < (int)uVar11; uVar11 = uVar11 - 1) {
        local_d0 = 1.0;
        pSVar6 = ((this->
                  super_SPxPricer<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                  ).thesolver)->thevectors;
        SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
        ::length2((number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                   *)&local_68,
                  (SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                   *)((pSVar6->set).theitem + (pSVar6->set).thekey[uVar11 - 1].idx));
        local_98 = (pointer)0xa00000000;
        _old_verbosity = (_func_int **)0x0;
        iStack_c0 = 0;
        iStack_bc = 0;
        local_b8 = (int *)0x0;
        uStack_b0._0_1_ = false;
        uStack_b0._1_4_ = 0;
        uStack_ab = 0;
        _local_a8 = 0;
        uStack_a3 = 0;
        local_a0 = 0;
        local_9c = false;
        boost::multiprecision::default_ops::
        eval_add_default<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,double>
                  ((cpp_dec_float<50U,_int,_void> *)&old_verbosity,&local_68,&local_d0);
        pnVar5 = (this_00->val).
                 super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        *(ulong *)((pnVar5->m_backend).data._M_elems + lVar16 * 2 + -4) =
             CONCAT35(uStack_a3,_local_a8);
        puVar1 = (pnVar5->m_backend).data._M_elems + lVar16 * 2 + -8;
        *(int **)puVar1 = local_b8;
        *(ulong *)(puVar1 + 2) = CONCAT35(uStack_ab,uStack_b0);
        puVar1 = (pnVar5->m_backend).data._M_elems + lVar16 * 2 + -0xc;
        *(_func_int ***)puVar1 = _old_verbosity;
        puVar1[2] = iStack_c0;
        puVar1[3] = iStack_bc;
        (pnVar5->m_backend).data._M_elems[lVar16 * 2 + -2] = local_a0;
        *(bool *)((pnVar5->m_backend).data._M_elems + lVar16 * 2 + -1) = local_9c;
        *(pointer *)((pnVar5->m_backend).data._M_elems + lVar16 * 2) = local_98;
        lVar16 = lVar16 + -7;
      }
    }
    else {
      pSVar4 = (this->
               super_SPxPricer<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
               ).thesolver;
      iVar13 = (pSVar4->thecovectors->set).thenum;
      std::__shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
                (&local_78,
                 &(pSVar4->
                  super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                  )._tolerances.super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>);
      SSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
      ::SSVectorBase((SSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                      *)&old_verbosity,iVar13,(shared_ptr<soplex::Tolerances> *)&local_78);
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_78._M_refcount);
      uVar11 = (ulong)(uint)(((this->
                              super_SPxPricer<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                              ).thesolver)->thecovectors->set).thenum;
      lVar15 = uVar11 * 0x38 + -8;
      lVar16 = uVar11 * 0x50;
      while( true ) {
        if ((int)uVar11 < 1) break;
        bVar7 = SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                ::isTimeLimitReached
                          ((this->
                           super_SPxPricer<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                           ).thesolver,false);
        if (bVar7) break;
        pSVar4 = (this->
                 super_SPxPricer<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                 ).thesolver;
        SPxBasisBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
        ::coSolve(&pSVar4->
                   super_SPxBasisBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                  ,(SSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                    *)&old_verbosity,
                  (SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                   *)((long)(pSVar4->unitVecs).data.
                            super__Vector_base<soplex::UnitVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>,_std::allocator<soplex::UnitVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_start[-1].themem.val.m_backend.data.
                            _M_elems + lVar16 + -0x10));
        SSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
        ::length2((number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                   *)&local_68,
                  (SSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                   *)&old_verbosity);
        pnVar5 = (this_01->val).
                 super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        *(undefined8 *)((long)(pnVar5->m_backend).data._M_elems + lVar15 + -0x10) =
             local_68.data._M_elems._32_8_;
        puVar1 = (uint *)((long)(pnVar5->m_backend).data._M_elems + lVar15 + -0x20);
        *(undefined8 *)puVar1 = local_68.data._M_elems._16_8_;
        *(undefined8 *)(puVar1 + 2) = local_68.data._M_elems._24_8_;
        puVar2 = (undefined8 *)((long)(pnVar5->m_backend).data._M_elems + lVar15 + -0x30);
        *puVar2 = CONCAT44(local_68.data._M_elems[1],local_68.data._M_elems[0]);
        puVar2[1] = local_68.data._M_elems._8_8_;
        *(int *)((long)(pnVar5->m_backend).data._M_elems + lVar15 + -8) = local_68.exp;
        *(bool *)((long)(pnVar5->m_backend).data._M_elems + lVar15 + -4) = local_68.neg;
        *(undefined8 *)((long)(pnVar5->m_backend).data._M_elems + lVar15) = local_68._48_8_;
        uVar11 = (ulong)((int)uVar11 - 1);
        lVar15 = lVar15 + -0x38;
        lVar16 = lVar16 + -0x50;
      }
      SSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
      ::~SSVectorBase((SSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                       *)&old_verbosity);
    }
  }
  ((this->
   super_SPxPricer<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
   ).thesolver)->weightsAreSetup = true;
  return;
}

Assistant:

void SPxSteepPR<R>::setupWeights(typename SPxSolverBase<R>::Type type)
{
   int i;
   int endDim = 0;
   int endCoDim = 0;
   VectorBase<R>& weights = this->thesolver->weights;
   VectorBase<R>& coWeights = this->thesolver->coWeights;

   if(setup == DEFAULT)
   {
      if(type == SPxSolverBase<R>::ENTER)
      {
         if(this->thesolver->weightsAreSetup)
         {
            // check for added/removed rows and adapt norms accordingly
            if(coWeights.dim() < this->thesolver->dim())
               endDim = coWeights.dim();
            else
               endDim = this->thesolver->dim();

            if(weights.dim() < this->thesolver->coDim())
               endCoDim = weights.dim();
            else
               endCoDim = this->thesolver->coDim();
         }

         coWeights.reDim(this->thesolver->dim(), false);

         for(i = this->thesolver->dim() - 1; i >= endDim; --i)
            coWeights[i] = 2.0;

         weights.reDim(this->thesolver->coDim(), false);

         for(i = this->thesolver->coDim() - 1; i >= endCoDim; --i)
            weights[i] = 1.0;
      }
      else
      {
         assert(type == SPxSolverBase<R>::LEAVE);

         if(this->thesolver->weightsAreSetup)
         {
            // check for added/removed rows and adapt norms accordingly
            if(coWeights.dim() < this->thesolver->dim())
               endDim = coWeights.dim();
            else
               endDim = this->thesolver->dim();
         }

         coWeights.reDim(this->thesolver->dim(), false);

         for(i = this->thesolver->dim() - 1; i >= endDim; --i)
            coWeights[i]   = 1.0;
      }
   }
   else
   {
      SPX_MSG_INFO1((*this->thesolver->spxout),
                    (*this->thesolver->spxout) << " --- initializing steepest edge multipliers" << std::endl;)

      if(type == SPxSolverBase<R>::ENTER)
      {
         coWeights.reDim(this->thesolver->dim(), false);

         for(i = this->thesolver->dim() - 1; i >= endDim; --i)
            coWeights[i] = 1.0;

         weights.reDim(this->thesolver->coDim(), false);

         for(i = this->thesolver->coDim() - 1; i >= endCoDim; --i)
            weights[i] = 1.0 + this->thesolver->vector(i).length2();
      }
      else
      {
         assert(type == SPxSolverBase<R>::LEAVE);
         coWeights.reDim(this->thesolver->dim(), false);
         SSVectorBase<R>  tmp(this->thesolver->dim(), this->thesolver->tolerances());

         for(i = this->thesolver->dim() - 1; i >= endDim && !this->thesolver->isTimeLimitReached(); --i)
         {
            this->thesolver->basis().coSolve(tmp, this->thesolver->unitVector(i));
            coWeights[i] = tmp.length2();
         }
      }
   }

   this->thesolver->weightsAreSetup = true;
}